

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O1

Maybe<kj::Own<kj::_::Event>_> __thiscall kj::_::ExclusiveJoinPromiseNode::Branch::fire(Branch *this)

{
  Maybe<kj::Exception> *pMVar1;
  Event *extraout_RDX;
  long in_RSI;
  Maybe<kj::Own<kj::_::Event>_> MVar2;
  Runnable local_2e8 [2];
  Maybe<kj::Exception> local_2d8;
  Maybe<kj::Exception> local_178;
  
  if (*(long *)(in_RSI + 0x28) + 8 == in_RSI) {
    local_2e8[0]._vptr_Runnable = (_func_int **)&PTR_run_00466080;
    runCatchingExceptions(&local_178,local_2e8);
    if (local_178.ptr.isSet == false) goto LAB_0030efb8;
    pMVar1 = &local_178;
  }
  else {
    local_2e8[0]._vptr_Runnable = (_func_int **)&PTR_run_004660b0;
    runCatchingExceptions(&local_2d8,local_2e8);
    if (local_2d8.ptr.isSet != true) goto LAB_0030efb8;
    pMVar1 = &local_2d8;
  }
  Exception::~Exception(&(pMVar1->ptr).field_1.value);
LAB_0030efb8:
  PromiseNode::OnReadyEvent::arm((OnReadyEvent *)(*(long *)(in_RSI + 0x28) + 0x88));
  (this->super_Event)._vptr_Event = (_func_int **)0x0;
  (this->super_Event).loop = (EventLoop *)0x0;
  MVar2.ptr.ptr = extraout_RDX;
  MVar2.ptr.disposer = (Disposer *)this;
  return (Maybe<kj::Own<kj::_::Event>_>)MVar2.ptr;
}

Assistant:

Maybe<Own<Event>> ExclusiveJoinPromiseNode::Branch::fire() {
  // Cancel the branch that didn't return first.  Ignore exceptions caused by cancellation.
  if (this == &joinNode.left) {
    kj::runCatchingExceptions([&]() { joinNode.right.dependency = nullptr; });
  } else {
    kj::runCatchingExceptions([&]() { joinNode.left.dependency = nullptr; });
  }

  joinNode.onReadyEvent.arm();
  return nullptr;
}